

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::Reset(EntryPointInfo *this,bool resetStateToNotScheduled)

{
  NativeEntryPointData *this_00;
  code *pcVar1;
  State SVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  
  SVar2 = GetState(this);
  if (SVar2 == CleanedUp) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2356,"(this->GetState() != CleanedUp)",
                                "this->GetState() != CleanedUp");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (this->workItem).ptr = (CodeGenWorkItem *)0x0;
  this_00 = (this->nativeEntryPointData).ptr;
  if (this_00 != (NativeEntryPointData *)0x0) {
    scriptContext = GetScriptContext(this);
    NativeEntryPointData::Cleanup(this_00,scriptContext,false,true);
    (this->nativeEntryPointData).ptr = (NativeEntryPointData *)0x0;
  }
  if (resetStateToNotScheduled) {
    this->state = NotScheduled;
  }
  return;
}

Assistant:

void EntryPointInfo::Reset(bool resetStateToNotScheduled)
    {
        Assert(this->GetState() != CleanedUp);
        this->workItem = nullptr;
#if ENABLE_NATIVE_CODEGEN
        if (this->nativeEntryPointData)
        {
            this->nativeEntryPointData->Cleanup(GetScriptContext(), false, true);
            this->nativeEntryPointData = nullptr;
        }
#endif
        // Set the state to NotScheduled only if the call to Reset is not because of JIT cap being reached
        if (resetStateToNotScheduled)
        {
            this->state = NotScheduled;
        }
    }